

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * mshot_xname(obj *obj)

{
  int iVar1;
  char *__src;
  char *pcVar2;
  char *onm;
  char tmpbuf [256];
  obj *obj_local;
  
  __src = xname(obj);
  if ((1 < m_shot.n) && (m_shot.o == obj->otyp)) {
    strcpy((char *)&onm,__src);
    iVar1 = m_shot.i;
    pcVar2 = ordin(m_shot.i);
    sprintf(__src,"the %d%s %s",(ulong)(uint)iVar1,pcVar2,&onm);
  }
  return __src;
}

Assistant:

char *mshot_xname(const struct obj *obj)
{
    char tmpbuf[BUFSZ];
    char *onm = xname(obj);

    if (m_shot.n > 1 && m_shot.o == obj->otyp) {
	/* copy xname's result so that we can reuse its return buffer */
	strcpy(tmpbuf, onm);
	/* "the Nth arrow"; value will eventually be passed to an() or
	   The(), both of which correctly handle this "the " prefix */
	sprintf(onm, "the %d%s %s", m_shot.i, ordin(m_shot.i), tmpbuf);
    }

    return onm;
}